

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::initClass(Forth *this)

{
  size_t sVar1;
  Forth *this_local;
  
  ForthStack<unsigned_int>::resetStack(&this->dStack);
  ForthStack<unsigned_int>::resetStack(&this->rStack);
  ForthStack<unsigned_int>::resetStack(&this->returnStack);
  ForthStack<unsigned_int>::resetStack(&this->controlStackLoops);
  ForthStack<unsigned_int>::resetStack(&this->controlStackIf_Begin);
  ForthStack<unsigned_int>::resetStack(&this->catchStack);
  do {
    sVar1 = RestoreInput(this);
  } while (sVar1 != 0);
  this->next_command = 0;
  this->InterpretState = InterpretSource;
  return;
}

Assistant:

void initClass(){
			// clear datastack
			dStack.resetStack();
			// clear return stack
			rStack.resetStack();
			returnStack.resetStack();
			// clear floating point stack
			// clear control stacks
			controlStackLoops.resetStack();
			// control stack for IF ELSE THEN Begin While Repeat Until Again
			controlStackIf_Begin.resetStack();
			// clear excepion stack
			catchStack.resetStack();
			// clear source/evaluation stack
			while (RestoreInput()); // returns depth of the stack decremented by 1 every call . Or returns 0; 
			// next operation to 0
			next_command = 0;
			// interpretation state
			InterpretState = InterpretSource;
			// SOURCE-ID =0
		}